

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3FixSelect(DbFixer *pFix,Select *pSelect)

{
  int iVar1;
  
  if (pSelect != (Select *)0x0) {
    do {
      iVar1 = sqlite3FixExprList(pFix,pSelect->pEList);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = sqlite3FixSrcList(pFix,pSelect->pSrc);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = sqlite3FixExpr(pFix,pSelect->pWhere);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = sqlite3FixExpr(pFix,pSelect->pHaving);
      if (iVar1 != 0) {
        return 1;
      }
      pSelect = pSelect->pPrior;
    } while (pSelect != (Select *)0x0);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3FixSelect(
  DbFixer *pFix,       /* Context of the fixation */
  Select *pSelect      /* The SELECT statement to be fixed to one database */
){
  while( pSelect ){
    if( sqlite3FixExprList(pFix, pSelect->pEList) ){
      return 1;
    }
    if( sqlite3FixSrcList(pFix, pSelect->pSrc) ){
      return 1;
    }
    if( sqlite3FixExpr(pFix, pSelect->pWhere) ){
      return 1;
    }
    if( sqlite3FixExpr(pFix, pSelect->pHaving) ){
      return 1;
    }
    pSelect = pSelect->pPrior;
  }
  return 0;
}